

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymul.hpp
# Opt level: O3

void polymul_internal::polynomial_multiplier<double,_2,_1,_3>::mul_monomial
               (double *dst,double *p1,double *m2)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  
  iVar2 = binomial(5,3);
  lVar4 = 0;
  bVar1 = true;
  do {
    bVar3 = bVar1;
    lVar5 = 0;
    do {
      dst[(long)iVar2 + lVar4 + lVar5] =
           p1[lVar4 + 1] * m2[lVar5] + dst[(long)iVar2 + lVar4 + lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    lVar4 = 1;
    bVar1 = false;
  } while (bVar3);
  polynomial_multiplier<double,_2,_0,_3>::mul_monomial(dst,p1,m2);
  return;
}

Assistant:

static void mul_monomial(numtype POLYMUL_RESTRICT dst[],
                           const numtype p1[],
                           const numtype m2[]) {
    polynomial_multiplier<numtype, Nvar - 1, Ndeg1, Ndeg2>::mul(
        dst + binomial(Nvar + Ndeg1 + Ndeg2 - 1, Ndeg1 + Ndeg2 - 1),
        p1 + binomial(Nvar + Ndeg1 - 1, Ndeg1 - 1),
        m2);
    polynomial_multiplier<numtype, Nvar, Ndeg1 - 1, Ndeg2>::mul_monomial(
        dst, p1, m2);
  }